

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::
~ExceptionOr(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
             *this)

{
  ResponseHook *pRVar1;
  Disposer *pDVar2;
  
  if (((this->value).ptr.isSet == true) &&
     (pRVar1 = (this->value).ptr.field_1.value.hook.ptr, pRVar1 != (ResponseHook *)0x0)) {
    (this->value).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    pDVar2 = (this->value).ptr.field_1.value.hook.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pRVar1->_vptr_ResponseHook[-2] + (long)&pRVar1->_vptr_ResponseHook);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}